

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_initCStream_usingCDict_advanced
                 (ZSTD_CStream *zcs,ZSTD_CDict *cdict,ZSTD_frameParameters fParams,
                 unsigned_long_long pledgedSrcSize)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  size_t sVar6;
  long lVar7;
  int *piVar8;
  ZSTD_format_e *pZVar9;
  int *piVar10;
  undefined8 *puVar11;
  byte bVar12;
  ZSTD_CCtx_params in_stack_fffffffffffffec8;
  ZSTD_format_e local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined8 uStack_80;
  undefined8 local_78;
  int local_70;
  int local_6c [21];
  
  local_70 = fParams.noDictIDFlag;
  local_78 = fParams._0_8_;
  bVar12 = 0;
  if (cdict != (ZSTD_CDict *)0x0) {
    local_98 = (zcs->requestedParams).format;
    piVar8 = &(zcs->requestedParams).compressionLevel;
    piVar10 = local_6c;
    for (lVar7 = 0x15; lVar7 != 0; lVar7 = lVar7 + -1) {
      *piVar10 = *piVar8;
      piVar8 = piVar8 + 1;
      piVar10 = piVar10 + 1;
    }
    uVar1 = (cdict->matchState).cParams.windowLog;
    uVar2 = (cdict->matchState).cParams.chainLog;
    uVar3 = (cdict->matchState).cParams.hashLog;
    uVar4 = (cdict->matchState).cParams.searchLog;
    uVar5 = (cdict->matchState).cParams.minMatch;
    uStack_80._0_4_ = (cdict->matchState).cParams.targetLength;
    uStack_80._4_4_ = (cdict->matchState).cParams.strategy;
    uStack_94 = uVar1;
    uStack_90 = uVar2;
    uStack_8c = uVar3;
    uStack_88 = uVar4;
    uStack_84 = uVar5;
    ZSTD_freeCDict(zcs->cdictLocal);
    zcs->cdictLocal = (ZSTD_CDict *)0x0;
    zcs->cdict = cdict;
    pZVar9 = &local_98;
    puVar11 = (undefined8 *)&stack0xfffffffffffffec8;
    for (lVar7 = 0x10; lVar7 != 0; lVar7 = lVar7 + -1) {
      *puVar11 = *(undefined8 *)pZVar9;
      pZVar9 = pZVar9 + ((ulong)bVar12 * -2 + 1) * 2;
      puVar11 = puVar11 + (ulong)bVar12 * -2 + 1;
    }
    sVar6 = ZSTD_resetCStream_internal
                      (zcs,(void *)0x0,0,ZSTD_dct_auto,cdict,in_stack_fffffffffffffec8,
                       pledgedSrcSize);
    return sVar6;
  }
  return 0xffffffffffffffe0;
}

Assistant:

size_t ZSTD_initCStream_usingCDict_advanced(ZSTD_CStream* zcs,
                                            const ZSTD_CDict* cdict,
                                            ZSTD_frameParameters fParams,
                                            unsigned long long pledgedSrcSize)
{
    DEBUGLOG(4, "ZSTD_initCStream_usingCDict_advanced");
    if (!cdict) return ERROR(dictionary_wrong); /* cannot handle NULL cdict (does not know what to do) */
    {   ZSTD_CCtx_params params = zcs->requestedParams;
        params.cParams = ZSTD_getCParamsFromCDict(cdict);
        params.fParams = fParams;
        return ZSTD_initCStream_internal(zcs,
                                NULL, 0, cdict,
                                params, pledgedSrcSize);
    }
}